

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEmbed.c
# Opt level: O0

void Emb_ManComputeDimensions(Emb_Man_t *p,int nDims)

{
  int iVar1;
  uint hHandle;
  Vec_Int_t *pVVar2;
  Emb_Obj_t *pEVar3;
  Emb_Dat_t *pEVar4;
  bool bVar5;
  Emb_Obj_t *pObj;
  Emb_Obj_t *pFanin;
  int i;
  int nReached;
  int d;
  Vec_Int_t *vComps;
  Vec_Int_t *vStart;
  Emb_Obj_t *pPivot;
  Emb_Obj_t *pRandom;
  int nDims_local;
  Emb_Man_t *p_local;
  
  pVVar2 = Emb_ManConnectedComponents(p);
  iVar1 = Vec_IntSize(pVVar2);
  if (1 < iVar1) {
    pEVar3 = Emb_ManObj(p,0);
    pFanin._4_4_ = 0;
    while( true ) {
      iVar1 = Vec_IntSize(pVVar2);
      bVar5 = false;
      if (pFanin._4_4_ < iVar1) {
        hHandle = Vec_IntEntry(pVVar2,pFanin._4_4_);
        pObj = Emb_ManObj(p,hHandle);
        bVar5 = pObj != (Emb_Obj_t *)0x0;
      }
      if (!bVar5) break;
      iVar1 = Emb_ObjIsCo(pObj);
      if (iVar1 == 0) {
        __assert_fail("Emb_ObjIsCo(pFanin)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaEmbed.c"
                      ,0x45c,"void Emb_ManComputeDimensions(Emb_Man_t *, int)");
      }
      iVar1 = pEVar3->hHandle - pObj->hHandle;
      *(int *)(&pEVar3[1].field_0x0 + (long)pFanin._4_4_ * 4) = iVar1;
      *(int *)(&pObj[1].field_0x0 + (ulong)(((*(uint *)pObj >> 4) + pObj->nFanouts) - 1) * 4) =
           iVar1;
      pFanin._4_4_ = pFanin._4_4_ + 1;
    }
  }
  Vec_IntFree(pVVar2);
  if (p->pVecs != (Emb_Dat_t *)0x0) {
    __assert_fail("p->pVecs == NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaEmbed.c"
                  ,0x463,"void Emb_ManComputeDimensions(Emb_Man_t *, int)");
  }
  pEVar4 = (Emb_Dat_t *)calloc((long)(p->nObjs * nDims),4);
  p->pVecs = pEVar4;
  pVVar2 = Vec_IntAlloc(nDims);
  pEVar3 = Emb_ManRandomVertex(p);
  Vec_IntPush(pVVar2,pEVar3->hHandle);
  vStart = (Vec_Int_t *)Emb_ManFindDistances(p,pVVar2,(Emb_Dat_t *)0x0);
  iVar1 = p->nReached;
  Emb_ManObjNum(p);
  Vec_IntClear(pVVar2);
  for (i = 0; (i < nDims && (Vec_IntPush(pVVar2,*(int *)&vStart->pArray), i + 1 != iVar1));
      i = i + 1) {
    pEVar4 = Emb_ManVec(p,i);
    vStart = (Vec_Int_t *)Emb_ManFindDistances(p,pVVar2,pEVar4);
    if (iVar1 != p->nReached) {
      __assert_fail("nReached == p->nReached",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaEmbed.c"
                    ,0x47c,"void Emb_ManComputeDimensions(Emb_Man_t *, int)");
    }
  }
  Vec_IntFree(pVVar2);
  return;
}

Assistant:

void Emb_ManComputeDimensions( Emb_Man_t * p, int nDims )
{
    Emb_Obj_t * pRandom, * pPivot;
    Vec_Int_t * vStart, * vComps;
    int d, nReached;
    int i;//, Counter;
    // connect unconnected components
    vComps = Emb_ManConnectedComponents( p );
//    printf( "Components = %d. Considered %d objects (out of %d).\n", Vec_IntSize(vComps), p->nReached, Emb_ManObjNum(p) );
    if ( Vec_IntSize(vComps) > 1 )
    {
        Emb_Obj_t * pFanin, * pObj = Emb_ManObj( p, 0 );
        Emb_ManForEachObjVec( vComps, p, pFanin, i )
        {
            assert( Emb_ObjIsCo(pFanin) );
            pFanin->Fanios[pFanin->nFanins + pFanin->nFanouts-1] = 
                pObj->Fanios[i] = pObj->hHandle - pFanin->hHandle;
        }
    }
    Vec_IntFree( vComps );
    // allocate memory for vectors
    assert( p->pVecs == NULL );
    p->pVecs = ABC_CALLOC( Emb_Dat_t, p->nObjs * nDims );
//    for ( i = 0; i < p->nObjs * nDims; i++ )
//        p->pVecs[i] = ABC_INFINITY;
    vStart = Vec_IntAlloc( nDims );
    // get the pivot vertex
    pRandom = Emb_ManRandomVertex( p );
    Vec_IntPush( vStart, pRandom->hHandle );
    // get the most distant vertex from the pivot
    pPivot = Emb_ManFindDistances( p, vStart, NULL );
//    Emb_DumpGraphIntoFile( p );
    nReached = p->nReached;
    if ( nReached < Emb_ManObjNum(p) )
    {
//        printf( "Considering a connected component with %d objects (out of %d).\n", p->nReached, Emb_ManObjNum(p) );
    }
    // start dimensions with this vertex
    Vec_IntClear( vStart );
    for ( d = 0; d < nDims; d++ )
    {
//        printf( "%3d : Adding vertex %7d with distance %3d.\n", d+1, pPivot->Value, p->nDistMax ); 
        Vec_IntPush( vStart, pPivot->hHandle );
        if ( d+1 == nReached )
            break;
        pPivot = Emb_ManFindDistances( p, vStart, Emb_ManVec(p, d) );
        assert( nReached == p->nReached );
    }
    Vec_IntFree( vStart );
    // make sure the number of reached objects is correct
//    Counter = 0;
//    for ( i = 0; i < p->nObjs; i++ )
//        if ( p->pVecs[i] < ABC_INFINITY )
//            Counter++;
//    assert( Counter == nReached );
}